

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O1

void __thiscall
booster::callback<int_()>::callback<call_counter>(callback<int_()> *this,call_counter func)

{
  callable<int_()> *pcVar1;
  
  pcVar1 = (callable<int_()> *)operator_new(0x18);
  (pcVar1->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__refcounted_0010ba78;
  booster::atomic_counter::atomic_counter(&(pcVar1->super_refcounted).refs_,0);
  (pcVar1->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__refcounted_0010bd10;
  *(int *)&pcVar1[1].super_refcounted._vptr_refcounted = func.counter;
  (this->call_ptr).p_ = pcVar1;
  booster::atomic_counter::inc();
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}